

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.cc
# Opt level: O3

bool __thiscall
gvr::MultiTexturedMesh::getUsedByTexture
          (MultiTexturedMesh *this,int t,vector<bool,_std::allocator<bool>_> *vused,
          vector<bool,_std::allocator<bool>_> *tused)

{
  ulong *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  uint *puVar11;
  
  uVar7 = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            (vused,(long)(this->super_Mesh).super_PointCloud.n,false);
  std::vector<bool,_std::allocator<bool>_>::resize(tused,(long)(this->super_Mesh).n,false);
  uVar2 = (this->super_Mesh).super_PointCloud.n;
  if (0 < (int)uVar2) {
    lVar10 = *(long *)vused;
    do {
      bVar5 = (byte)uVar7 & 0x3f;
      puVar1 = (ulong *)(lVar10 + (ulong)(uVar7 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  uVar2 = (this->super_Mesh).n;
  lVar10 = (long)(int)uVar2;
  uVar6 = 0;
  if (0 < lVar10) {
    lVar3 = *(long *)tused;
    do {
      bVar5 = (byte)uVar6 & 0x3f;
      puVar1 = (ulong *)(lVar3 + (uVar6 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      uVar7 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar7;
    } while (uVar2 != uVar7);
    if ((int)uVar2 < 1) {
      uVar6 = 0;
    }
    else {
      lVar3 = *(long *)vused;
      lVar4 = *(long *)tused;
      uVar8 = lVar10 + 1;
      piVar9 = &this->uvt[lVar10 + -1].t;
      puVar11 = (this->super_Mesh).triangle + lVar10 * 3 + -1;
      uVar6 = 0;
      do {
        if (*piVar9 == t) {
          puVar1 = (ulong *)(lVar3 + (ulong)(puVar11[-2] >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)puVar11[-2] & 0x3f);
          puVar1 = (ulong *)(lVar3 + (ulong)(puVar11[-1] >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)puVar11[-1] & 0x3f);
          puVar1 = (ulong *)(lVar3 + (ulong)(*puVar11 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)*puVar11 & 0x3f);
          puVar1 = (ulong *)(lVar4 + (uVar8 - 2 >> 6 & 0x3ffffff) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)(uVar8 - 2) & 0x3f);
          uVar6 = 1;
        }
        uVar8 = uVar8 - 1;
        piVar9 = piVar9 + -7;
        puVar11 = puVar11 + -3;
      } while (1 < uVar8);
    }
  }
  return SUB81(uVar6,0);
}

Assistant:

bool MultiTexturedMesh::getUsedByTexture(int t, std::vector<bool> &vused, std::vector<bool> &tused)
{
  vused.resize(getVertexCount());
  tused.resize(getTriangleCount());

  for (int i=0; i<getVertexCount(); i++)
  {
    vused[i]=false;
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    tused[i]=false;
  }

  bool ret=false;

  for (int i=getTriangleCount()-1; i>=0; i--)
  {
    if (getTextureIndex(i) == t)
    {
      vused[getTriangleIndex(i, 0)]=true;
      vused[getTriangleIndex(i, 1)]=true;
      vused[getTriangleIndex(i, 2)]=true;
      tused[i]=true;
      ret=true;
    }
  }

  return ret;
}